

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

Expr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                   *this)

{
  char code;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  char *pcVar1;
  int opcode;
  ExprBase EVar2;
  ExprBase EVar3;
  bool bVar4;
  
  bVar4 = false;
  do {
    this_00 = this->reader_;
    pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
    code = *pcVar1;
    if (code != 'o') {
      if (code == 'h') {
        BinaryReader<mp::internal::EndiannessConverter>::ReadString(this_00);
        EVar2.impl_ = (Impl *)0x0;
      }
      else {
        EVar2.impl_ = (Impl *)ReadNumericExpr(this,code,false);
      }
LAB_0045e238:
      EVar3.impl_ = (Impl *)0x0;
      if (!bVar4) {
        EVar3.impl_ = EVar2.impl_;
      }
      return (Expr)(ExprBase)EVar3.impl_;
    }
    opcode = ReadOpCode(this);
    if (opcode != 0x41) {
      EVar2.impl_ = (Impl *)ReadNumericExpr(this,opcode);
      goto LAB_0045e238;
    }
    ReadLogicalExpr(this);
    ReadSymbolicExpr(this);
    bVar4 = true;
  } while( true );
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}